

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_v_wasm.cpp
# Opt level: O0

string * __thiscall
wasm::getSig_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Type results,Type params)

{
  bool bVar1;
  char cVar2;
  Type *pTVar3;
  Iterator IVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Type *param;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  Type local_20;
  Type params_local;
  Type results_local;
  string *sig;
  
  local_20.id = results.id;
  params_local.id = (uintptr_t)this;
  bVar1 = Type::isTuple(&params_local);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    cVar2 = getSig(params_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
    IVar4 = Type::begin(&local_20);
    __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_20);
    while( true ) {
      __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar5.index;
      param = PVar5.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                 &param);
      if (!bVar1) break;
      pTVar3 = Type::Iterator::operator*
                         ((Iterator *)
                          &__end1.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      cVar2 = getSig((Type)pTVar3->id);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
      PVar5.index = (size_t)__end1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar5.parent = param;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!results.isTuple()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                ,0x46,"std::string wasm::getSig(Type, Type)");
}

Assistant:

std::string getSig(Type results, Type params) {
  assert(!results.isTuple());
  std::string sig;
  sig += getSig(results);
  for (const auto& param : params) {
    sig += getSig(param);
  }
  return sig;
}